

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O1

void __thiscall
Sock::SendComplete(Sock *this,Span<const_unsigned_char> data,milliseconds timeout,
                  CThreadInterrupt *interrupt)

{
  bool bVar1;
  int iVar2;
  time_point tVar3;
  int extraout_var;
  int *piVar4;
  runtime_error *prVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_t sVar6;
  long lVar7;
  CThreadInterrupt *args_1;
  long lVar8;
  long in_FS_OFFSET;
  size_t sent;
  int in_stack_ffffffffffffff7c;
  size_t local_80;
  size_t local_78 [4];
  string local_58;
  long local_38;
  
  sVar6 = data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = interrupt;
  tVar3 = NodeClock::now();
  lVar8 = (long)tVar3.__d.__r / 1000000 + timeout.__r;
  local_80 = 0;
  while( true ) {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4000;
    iVar2 = (*this->_vptr_Sock[3])(this,data.m_data + local_80,sVar6 - local_80);
    if (CONCAT44(extraout_var,iVar2) == 0 || extraout_var < 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (((iVar2 != 4) && (iVar2 != 0xb)) && (iVar2 != 0x73)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        SysErrorString_abi_cxx11_(in_stack_ffffffffffffff7c);
        tinyformat::format<std::__cxx11::string>
                  (&local_58,(tinyformat *)"send(): %s",(char *)local_78,args);
        std::runtime_error::runtime_error(prVar5,(string *)&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00e1db47;
      }
    }
    else {
      local_80 = CONCAT44(extraout_var,iVar2) + local_80;
      if (local_80 == sVar6) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
        goto LAB_00e1db47;
      }
    }
    tVar3 = NodeClock::now();
    lVar7 = lVar8 - (long)tVar3.__d.__r / 1000000;
    if (lVar7 == 0 || lVar8 < (long)tVar3.__d.__r / 1000000) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78[0] = sVar6;
      tinyformat::format<unsigned_long,unsigned_long>
                (&local_58,(tinyformat *)"Send timeout (sent only %u of %u bytes before that)",
                 (char *)&local_80,local_78,(unsigned_long *)args_1);
      std::runtime_error::runtime_error(prVar5,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00e1db47;
    }
    bVar1 = CThreadInterrupt::operator_cast_to_bool(interrupt);
    if (bVar1) break;
    if (999 < lVar7) {
      lVar7 = 1000;
    }
    (*this->_vptr_Sock[0xe])(this,lVar7,2,0);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_78[0] = sVar6;
  tinyformat::format<unsigned_long,unsigned_long>
            (&local_58,(tinyformat *)"Send interrupted (sent only %u of %u bytes before that)",
             (char *)&local_80,local_78,(unsigned_long *)args_1);
  std::runtime_error::runtime_error(prVar5,(string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00e1db47:
  __stack_chk_fail();
}

Assistant:

void Sock::SendComplete(Span<const unsigned char> data,
                        std::chrono::milliseconds timeout,
                        CThreadInterrupt& interrupt) const
{
    const auto deadline = GetTime<std::chrono::milliseconds>() + timeout;
    size_t sent{0};

    for (;;) {
        const ssize_t ret{Send(data.data() + sent, data.size() - sent, MSG_NOSIGNAL)};

        if (ret > 0) {
            sent += static_cast<size_t>(ret);
            if (sent == data.size()) {
                break;
            }
        } else {
            const int err{WSAGetLastError()};
            if (IOErrorIsPermanent(err)) {
                throw std::runtime_error(strprintf("send(): %s", NetworkErrorString(err)));
            }
        }

        const auto now = GetTime<std::chrono::milliseconds>();

        if (now >= deadline) {
            throw std::runtime_error(strprintf(
                "Send timeout (sent only %u of %u bytes before that)", sent, data.size()));
        }

        if (interrupt) {
            throw std::runtime_error(strprintf(
                "Send interrupted (sent only %u of %u bytes before that)", sent, data.size()));
        }

        // Wait for a short while (or the socket to become ready for sending) before retrying
        // if nothing was sent.
        const auto wait_time = std::min(deadline - now, std::chrono::milliseconds{MAX_WAIT_FOR_IO});
        (void)Wait(wait_time, SEND);
    }
}